

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::compatibilityFunctionsTest(ViewTest *this)

{
  return;
}

Assistant:

void ViewTest::compatibilityFunctionsTest()
{
    #ifdef MARRAY_COMPATIBILITY
    // permuteDimensions
    {
        std::size_t shape[] = {2, 4, 3}; 
        andres::Marray<float> m(&shape[0], &shape[3]);
        std::size_t perm[] = {0, 2, 1};
        andres::View<float> v = m.permuteDimensions(perm);
        andres::View<float> w = m.permutedView(perm);
        
        test(v.dimension() == w.dimension());
        for(std::size_t j=0; j<v.dimension(); ++j) {
            test(v.shape(j) == w.shape(j));
        }
        test(v.size() == w.size());
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == w(j));
        }
    }
    // shiftDimensions
    {
        std::size_t shape[] = {2, 4, 3}; 
        andres::Marray<float> m(&shape[0], &shape[3]);
        andres::View<float> v = m.shiftDimensions(2);
        andres::View<float> w = m.shiftedView(2);
        test(v.dimension() == w.dimension());
        for(std::size_t j=0; j<v.dimension(); ++j) {
            test(v.shape(j) == w.shape(j));
        }
        test(v.size() == w.size());
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == w(j));
        }
    }
    // subarray
    {
        std::size_t shape[] = {2, 4, 3}; 
        andres::Marray<float> m(&shape[0], &shape[3]);
        std::size_t b[] = {0, 2, 1};
        std::size_t s[] = {2, 1, 2};
        andres::View<float> v = m.view(b, s);
        std::size_t e[] = {2, 3, 3};
        andres::View<float> w = m.subarray(b, e);
        test(v.dimension() == w.dimension());
        for(std::size_t j=0; j<v.dimension(); ++j) {
            test(v.shape(j) == w.shape(j));
        }
        test(v.size() == w.size());
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == w(j));
        }
    }
    #endif // #ifdef MARRAY_COMPATIBILITY
}